

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_operator_expression.cpp
# Opt level: O3

bool __thiscall
duckdb::BoundOperatorExpression::Equals(BoundOperatorExpression *this,BaseExpression *other_p)

{
  bool bVar1;
  BoundOperatorExpression *pBVar2;
  
  bVar1 = BaseExpression::Equals((BaseExpression *)this,other_p);
  if (bVar1) {
    bVar1 = LogicalType::operator==
                      (&(this->super_Expression).return_type,(LogicalType *)(other_p + 1));
    if (bVar1) {
      pBVar2 = BaseExpression::Cast<duckdb::BoundOperatorExpression>(other_p);
      bVar1 = Expression::ListEquals(&this->children,&pBVar2->children);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool BoundOperatorExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundOperatorExpression>();
	if (!Expression::ListEquals(children, other.children)) {
		return false;
	}
	return true;
}